

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

int crnlib::MatchFinder_Create
              (CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,UInt32 matchMaxLen,
              UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  UInt32 UVar1;
  UInt32 UVar2;
  Byte *pBVar3;
  CLzRef *pCVar4;
  uint uVar5;
  UInt32 UVar6;
  uint uVar7;
  UInt32 UVar8;
  
  if (historySize < 0xc0000001) {
    UVar6 = keepAddBufferAfter + matchMaxLen;
    p->keepSizeBefore = keepAddBufferBefore + historySize + 1;
    p->keepSizeAfter = UVar6;
    uVar7 = (UVar6 + keepAddBufferBefore >> 1) +
            (historySize >> (2U - (historySize < 0x80000001) & 0x1f)) +
            historySize + keepAddBufferBefore + UVar6 + 0x80001;
    if (p->directInput == 0) {
      if ((p->bufferBase == (Byte *)0x0) || (p->blockSize != uVar7)) {
        (*alloc->Free)(alloc,p->bufferBase);
        p->bufferBase = (Byte *)0x0;
        p->blockSize = uVar7;
        pBVar3 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar7);
        p->bufferBase = pBVar3;
      }
      if (p->bufferBase == (Byte *)0x0) goto LAB_001a1ac5;
    }
    else {
      p->blockSize = uVar7;
    }
    p->matchMaxLen = matchMaxLen;
    p->fixedHashSize = 0;
    uVar7 = p->numHashBytes;
    uVar5 = 0xffff;
    if (((uVar7 != 2) &&
        (uVar5 = historySize - 1 >> 1 | historySize - 1, uVar5 = uVar5 >> 2 | uVar5,
        uVar5 = uVar5 >> 4 | uVar5, uVar5 = uVar5 >> 1 | uVar5 >> 9 | 0xffff, 0x1000000 < uVar5)) &&
       (uVar5 = uVar5 >> 1, uVar7 == 3)) {
      uVar5 = 0xffffff;
    }
    p->hashMask = uVar5;
    if (2 < uVar7) {
      p->fixedHashSize = 0x400;
    }
    if (3 < uVar7) {
      p->fixedHashSize = p->fixedHashSize + 0x10000;
    }
    if (4 < uVar7) {
      p->fixedHashSize = p->fixedHashSize + 0x100000;
    }
    UVar2 = uVar5 + 1 + p->fixedHashSize;
    UVar6 = p->numSons;
    p->historySize = historySize;
    UVar1 = p->hashSizeSum;
    p->hashSizeSum = UVar2;
    p->cyclicBufferSize = historySize + 1;
    UVar8 = historySize + 1 << (p->btMode != 0);
    p->numSons = UVar8;
    uVar7 = UVar8 + UVar2;
    if ((p->hash != (CLzRef *)0x0) && (UVar6 + UVar1 == uVar7)) {
      return 1;
    }
    (*alloc->Free)(alloc,p->hash);
    p->hash = (CLzRef *)0x0;
    pCVar4 = (CLzRef *)(*alloc->Alloc)(alloc,(ulong)uVar7 << 2);
    p->hash = pCVar4;
    if (pCVar4 != (CLzRef *)0x0) {
      p->son = pCVar4 + p->hashSizeSum;
      return 1;
    }
  }
LAB_001a1ac5:
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  if (p->directInput == 0) {
    (*alloc->Free)(alloc,p->bufferBase);
    p->bufferBase = (Byte *)0x0;
  }
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder* p, UInt32 historySize,
                       UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
                       ISzAlloc* alloc) {
  UInt32 sizeReserv;
  if (historySize > kMaxHistorySize) {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  sizeReserv = historySize >> 1;
  if (historySize > ((UInt32)2 << 30))
    sizeReserv = historySize >> 2;
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  if (LzInWindow_Create(p, sizeReserv, alloc)) {
    UInt32 newCyclicBufferSize = (historySize /* >> p->skipModeBits */) + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        /* hs >>= p->skipModeBits; */
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24)) {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2)
        p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3)
        p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4)
        p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      UInt32 prevSize = p->hashSizeSum + p->numSons;
      UInt32 newSize;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      p->numSons = (p->btMode ? newCyclicBufferSize * 2 : newCyclicBufferSize);
      newSize = p->hashSizeSum + p->numSons;
      if (p->hash != 0 && prevSize == newSize)
        return 1;
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->hash = AllocRefs(newSize, alloc);
      if (p->hash != 0) {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }
  MatchFinder_Free(p, alloc);
  return 0;
}